

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O2

void helper_crypto_sha1_3reg_arm(void *vd,void *vn,void *vm,uint32_t op)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  CRYPTO_STATE m;
  ulong local_18;
  ulong local_10;
  
  uVar1 = *vd;
  uVar3 = *(ulong *)((long)vd + 8);
  local_18 = *vm;
  local_10 = *(ulong *)((long)vm + 8);
  if (op == 3) {
    uVar1 = uVar1 ^ uVar3 ^ *vm;
    uVar3 = *vn ^ uVar3 ^ *(ulong *)((long)vm + 8);
  }
  else {
    uVar4 = *vn;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      uVar5 = (uint)uVar3;
      uVar7 = (uint)(uVar1 >> 0x20);
      uVar8 = (uint)(uVar3 >> 0x20);
      if (op == 2) {
        uVar8 = (uVar5 | uVar7) & uVar8 | uVar5 & uVar7;
      }
      else if (op == 1) {
        uVar8 = uVar5 ^ uVar8 ^ uVar7;
      }
      else {
        if (op != 0) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                     ,0x104,(char *)0x0);
        }
        uVar8 = uVar7 & (uVar8 ^ uVar5) ^ uVar8;
      }
      uVar6 = uVar3 >> 0x20;
      uVar3 = uVar3 << 0x20 | (ulong)(uVar7 << 0x1e | uVar7 >> 2);
      uVar1 = uVar1 << 0x20 |
              (ulong)((int)uVar4 + ((uint)uVar1 << 5 | (uint)uVar1 >> 0x1b) + uVar8 +
                     *(int *)((long)&local_18 + lVar2 * 4));
      uVar4 = uVar6;
    }
  }
  *(ulong *)vd = uVar1;
  *(ulong *)((long)vd + 8) = uVar3;
  return;
}

Assistant:

void HELPER(crypto_sha1_3reg)(void *vd, void *vn, void *vm, uint32_t op)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    if (op == 3) { /* sha1su0 */
        d.l[0] ^= d.l[1] ^ m.l[0];
        d.l[1] ^= n.l[0] ^ m.l[1];
    } else {
        int i;

        for (i = 0; i < 4; i++) {
            uint32_t t = 0;

            switch (op) {
            case 0: /* sha1c */
                t = cho(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            case 1: /* sha1p */
                t = par(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            case 2: /* sha1m */
                t = maj(CR_ST_WORD(d, 1), CR_ST_WORD(d, 2), CR_ST_WORD(d, 3));
                break;
            default:
                g_assert_not_reached();
            }
            t += rol32(CR_ST_WORD(d, 0), 5) + CR_ST_WORD(n, 0)
                 + CR_ST_WORD(m, i);

            CR_ST_WORD(n, 0) = CR_ST_WORD(d, 3);
            CR_ST_WORD(d, 3) = CR_ST_WORD(d, 2);
            CR_ST_WORD(d, 2) = ror32(CR_ST_WORD(d, 1), 2);
            CR_ST_WORD(d, 1) = CR_ST_WORD(d, 0);
            CR_ST_WORD(d, 0) = t;
        }
    }
    rd[0] = d.l[0];
    rd[1] = d.l[1];
}